

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

void __thiscall wabt::ExprVisitor::PushDefault(ExprVisitor *this,Expr *expr)

{
  State local_1c;
  Expr *local_18;
  Expr *expr_local;
  ExprVisitor *this_local;
  
  local_1c = Default;
  local_18 = expr;
  expr_local = (Expr *)this;
  std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::
  emplace_back<wabt::ExprVisitor::State>(&this->state_stack_,&local_1c);
  std::vector<wabt::Expr*,std::allocator<wabt::Expr*>>::emplace_back<wabt::Expr*&>
            ((vector<wabt::Expr*,std::allocator<wabt::Expr*>> *)&this->expr_stack_,&local_18);
  return;
}

Assistant:

void ExprVisitor::PushDefault(Expr* expr) {
  state_stack_.emplace_back(State::Default);
  expr_stack_.emplace_back(expr);
}